

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

bool __thiscall GGSock::Communicator::disconnect(Communicator *this)

{
  Data *pDVar1;
  lock_guard<std::mutex> lock;
  Data *data;
  mutex_type *in_stack_ffffffffffffffd8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  pDVar1 = getData((Communicator *)0x12d373);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pDVar1->isListening = false;
  pDVar1->isConnecting = false;
  pDVar1->isConnected = false;
  anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12d3b7);
  anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12d3c7);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12d3d3);
  return true;
}

Assistant:

bool Communicator::disconnect() {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        data.isListening = false;
        data.isConnecting = false;
        data.isConnected = false;

        ::closeAndReset(data.sdpeer);
        ::closeAndReset(data.sd);

        return true;
    }